

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IForReader.cpp
# Opt level: O0

bool __thiscall IForReader::forward(IForReader *this,int base_pos,int end_pos)

{
  ostream *poVar1;
  uint deep;
  ulong uVar2;
  ssize_t sVar3;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  int iVar4;
  ifstream *piVar5;
  byte local_2bf;
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  undefined1 local_218 [8];
  ISingleStringReader iForStringReader;
  string local_1b0 [32];
  undefined1 local_190 [8];
  ISingleCharReader iBracket1lReader;
  ISentenceReader iSentenceReader2;
  undefined1 local_d0 [8];
  ISentenceReader iSentenceReader;
  IBlockReader iBlockReader;
  int end_pos_local;
  int base_pos_local;
  IForReader *this_local;
  
  IBlockReader::IBlockReader
            ((IBlockReader *)&iSentenceReader.field_0x60,(this->super_IAbstractReader).m_ifs,
             (this->super_IAbstractReader).m_os,(this->super_IAbstractReader).m_deep + 1);
  ISentenceReader::ISentenceReader
            ((ISentenceReader *)local_d0,(this->super_IAbstractReader).m_ifs,
             (this->super_IAbstractReader).m_os,(this->super_IAbstractReader).m_deep + 1,';');
  ISentenceReader::ISentenceReader
            ((ISentenceReader *)&iBracket1lReader.m_char,(this->super_IAbstractReader).m_ifs,
             (this->super_IAbstractReader).m_os,(this->super_IAbstractReader).m_deep + 1,')');
  piVar5 = (this->super_IAbstractReader).m_ifs;
  poVar1 = (this->super_IAbstractReader).m_os;
  iVar4 = (this->super_IAbstractReader).m_deep;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"Bracket1l",(allocator *)&iForStringReader.field_0x5f);
  ISingleCharReader::ISingleCharReader
            ((ISingleCharReader *)local_190,piVar5,poVar1,iVar4 + 1,'(',(string *)local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&iForStringReader.field_0x5f);
  piVar5 = (this->super_IAbstractReader).m_ifs;
  poVar1 = (this->super_IAbstractReader).m_os;
  deep = (this->super_IAbstractReader).m_deep + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"for",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"Keyword",&local_261);
  __nbytes = (size_t)deep;
  ISingleStringReader::ISingleStringReader
            ((ISingleStringReader *)local_218,piVar5,poVar1,deep,(string *)local_238,
             (string *)local_260);
  iVar4 = (int)piVar5;
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  uVar2 = IAbstractReader::read((IAbstractReader *)local_218,iVar4,__buf,__nbytes);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = IAbstractReader::read((IAbstractReader *)local_190,iVar4,__buf_00,__nbytes);
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = IAbstractReader::read((IAbstractReader *)local_d0,iVar4,__buf_01,__nbytes);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        uVar2 = IAbstractReader::read((IAbstractReader *)local_d0,iVar4,__buf_02,__nbytes);
        if ((uVar2 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          uVar2 = IAbstractReader::read
                            ((IAbstractReader *)&iBracket1lReader.m_char,iVar4,__buf_03,__nbytes);
          if ((uVar2 & 1) == 0) {
            this_local._7_1_ = false;
          }
          else {
            uVar2 = IAbstractReader::read
                              ((IAbstractReader *)&iSentenceReader.field_0x60,iVar4,__buf_04,
                               __nbytes);
            local_2bf = 0;
            if ((uVar2 & 1) == 0) {
              sVar3 = IAbstractReader::read
                                ((IAbstractReader *)local_d0,iVar4,__buf_05,
                                 CONCAT71((int7)(__nbytes >> 8),(char)uVar2));
              local_2bf = (byte)sVar3 ^ 0xff;
            }
            this_local._7_1_ = (bool)((local_2bf ^ 0xff) & 1);
          }
        }
      }
    }
  }
  ISingleStringReader::~ISingleStringReader((ISingleStringReader *)local_218);
  ISingleCharReader::~ISingleCharReader((ISingleCharReader *)local_190);
  ISentenceReader::~ISentenceReader((ISentenceReader *)&iBracket1lReader.m_char);
  ISentenceReader::~ISentenceReader((ISentenceReader *)local_d0);
  IBlockReader::~IBlockReader((IBlockReader *)&iSentenceReader.field_0x60);
  return this_local._7_1_;
}

Assistant:

bool IForReader::forward(int base_pos, int end_pos) {
    IBlockReader iBlockReader(m_ifs,m_os,m_deep+1);
    ISentenceReader iSentenceReader(m_ifs,m_os,m_deep+1);
    ISentenceReader iSentenceReader2(m_ifs,m_os,m_deep+1,')');
    ISingleCharReader iBracket1lReader(m_ifs, m_os, m_deep + 1,'(',"Bracket1l");
    ISingleStringReader iForStringReader(m_ifs, m_os, m_deep + 1,"for");

    if(!iForStringReader.read())
        return false;
    if(!iBracket1lReader.read())
        return false;

    if(!iSentenceReader.read())
        return false;
    if(!iSentenceReader.read())
        return false;
    if(!iSentenceReader2.read())
        return false;

    return !(!iBlockReader.read() && !iSentenceReader.read());
}